

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void Catch::anon_unknown_26::normalizeNamespaceMarkers(string *str)

{
  undefined8 local_18;
  size_t pos;
  string *str_local;
  
  local_18 = std::__cxx11::string::find((char *)str,0x2fd80c);
  while (local_18 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)str,local_18,(char *)0x2);
    local_18 = std::__cxx11::string::find((char *)str,0x2fd80c);
  }
  return;
}

Assistant:

static void normalizeNamespaceMarkers(std::string& str) {
            std::size_t pos = str.find( "::" );
            while ( pos != str.npos ) {
                str.replace( pos, 2, "." );
                pos += 1;
                pos = str.find( "::", pos );
            }
        }